

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void BotTest<generic_bots::MinimaxBot<uttt::IBoard,minimax::ABeta<uttt::IBoard,uttt::Eval1>>,uttt::IBoard>
               (void)

{
  ostream *poVar1;
  int depth;
  MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_> bot;
  IBoard game;
  
  uttt::IBoard::IBoard(&game);
  for (depth = 1; depth != 0xd; depth = depth + 1) {
    generic_bots::MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_>::MinimaxBot
              (&bot,&game,depth);
    std::chrono::_V2::system_clock::now();
    generic_bots::MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_>::MakeMove
              (&bot);
    std::chrono::_V2::system_clock::now();
    poVar1 = std::operator<<((ostream *)&std::cout,"Depth: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,depth);
    poVar1 = std::operator<<(poVar1," in ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::operator<<(poVar1," milliseconds\n");
    poVar1 = std::operator<<((ostream *)&std::cout,"Move: ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::operator<<(poVar1,'\n');
    bot.super_IBot<uttt::IBoard>._vptr_IBot = (_func_int **)&PTR__IBot_0017f838;
    operator_delete(bot.super_IBot<uttt::IBoard>.game);
  }
  return;
}

Assistant:

void
BotTest()
{
    IGame game;
    for (int i = 1; i < 13; ++i)
    {
        IBot bot(&game, i);
        auto t1 = std::chrono::high_resolution_clock::now();
        auto m = bot.MakeMove();
        auto t2 = std::chrono::high_resolution_clock::now();
        auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
        std::cout << "Depth: " << i << " in " << millis << " milliseconds\n";
        std::cout << "Move: " << m << '\n';
    }
}